

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall basisu::vector<basisu::encoder_block>::clear(vector<basisu::encoder_block> *this)

{
  long lVar1;
  encoder_block *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  lVar1._0_4_ = in_RDI->m_endpoint_predictor;
  lVar1._4_4_ = in_RDI->m_endpoint_index;
  if (lVar1 != 0) {
    scalar_type<basisu::encoder_block>::destruct_array(in_RDI,in_stack_ffffffffffffffe8);
    free(*(void **)in_RDI);
    in_RDI->m_endpoint_predictor = 0;
    in_RDI->m_endpoint_index = 0;
    in_RDI->m_selector_index = 0;
    in_RDI->m_selector_history_buf_index = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }